

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.h
# Opt level: O2

bool __thiscall
flagser_parameters::has_zero_filtration_and_no_explicit_output
          (flagser_parameters *this,named_arguments_t *named_arguments)

{
  bool bVar1;
  char *pcVar2;
  allocator local_73;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_50,"out-format",&local_71);
  pcVar2 = get_argument_or_default(named_arguments,&local_50,"");
  if (*pcVar2 == '\0') {
    std::__cxx11::string::string((string *)&local_70,"filtration",&local_72);
    pcVar2 = get_argument_or_default(named_arguments,&local_70,"zero");
    std::__cxx11::string::string((string *)&local_30,pcVar2,&local_73);
    bVar1 = std::operator==(&local_30,"zero");
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

bool has_zero_filtration_and_no_explicit_output(const named_arguments_t& named_arguments) {
		return strlen(get_argument_or_default(named_arguments, "out-format", "")) == 0 &&
		       std::string(get_argument_or_default(named_arguments, "filtration", "zero")) == "zero";
	}